

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

void __thiscall soul::StructuralParser::giveErrorOnExternalKeyword(StructuralParser *this)

{
  bool bVar1;
  CompileMessage local_50;
  char *local_18;
  StructuralParser *local_10;
  StructuralParser *this_local;
  
  local_18 = "external";
  local_10 = this;
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matches(&this->super_SOULTokeniser,(TokenType)"external");
  if (bVar1) {
    Errors::externalOnlyAllowedOnStateVars<>();
    (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_50);
    CompileMessage::~CompileMessage(&local_50);
  }
  return;
}

Assistant:

void giveErrorOnExternalKeyword()
    {
        if (matches (Keyword::external))
            throwError (Errors::externalOnlyAllowedOnStateVars());
    }